

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall amrex::BaseFab<amrex::EBCellFlag>::define(BaseFab<amrex::EBCellFlag> *this)

{
  size_t sz;
  Long LVar1;
  Arena *pAVar2;
  DataAllocator *in_RDI;
  Box *unaff_retaddr;
  size_t in_stack_00000290;
  Long in_stack_00000298;
  Long in_stack_000002a0;
  
  if (*(int *)((long)&in_RDI[6].m_arena + 4) != 0) {
    sz = (size_t)*(int *)((long)&in_RDI[6].m_arena + 4);
    LVar1 = Box::numPts(unaff_retaddr);
    in_RDI[7].m_arena = (Arena *)(sz * LVar1);
    *(undefined1 *)&in_RDI[8].m_arena = 1;
    pAVar2 = (Arena *)DataAllocator::alloc(in_RDI,sz);
    in_RDI[2].m_arena = pAVar2;
    placementNew<amrex::EBCellFlag>((EBCellFlag *)in_RDI,sz);
    Box::numPts(unaff_retaddr);
    update_fab_stats(in_stack_000002a0,in_stack_00000298,in_stack_00000290);
  }
  return;
}

Assistant:

void
BaseFab<T>::define ()
{
    AMREX_ASSERT(this->dptr == 0);
    AMREX_ASSERT(this->domain.numPts() > 0);
    AMREX_ASSERT(this->nvar >= 0);
    if (this->nvar == 0) return;
    AMREX_ASSERT(std::numeric_limits<Long>::max()/this->nvar > this->domain.numPts());

    this->truesize  = this->nvar*this->domain.numPts();
    this->ptr_owner = true;
    this->dptr = static_cast<T*>(this->alloc(this->truesize*sizeof(T)));

    placementNew(this->dptr, this->truesize);

    amrex::update_fab_stats(this->domain.numPts(), this->truesize, sizeof(T));
}